

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::CodedInputStream
          (CodedInputStream *this,uint8 *buffer,int size)

{
  int size_local;
  uint8 *buffer_local;
  CodedInputStream *this_local;
  
  this->input_ = (ZeroCopyInputStream *)0x0;
  this->buffer_ = buffer;
  this->buffer_end_ = buffer + size;
  this->total_bytes_read_ = size;
  this->overflow_bytes_ = 0;
  this->last_tag_ = 0;
  this->legitimate_message_end_ = false;
  this->aliasing_enabled_ = false;
  this->current_limit_ = size;
  this->buffer_size_after_limit_ = 0;
  this->total_bytes_limit_ = 0x4000000;
  this->total_bytes_warning_threshold_ = 0x2000000;
  this->recursion_depth_ = 0;
  this->recursion_limit_ = default_recursion_limit_;
  this->extension_pool_ = (DescriptorPool *)0x0;
  this->extension_factory_ = (MessageFactory *)0x0;
  return;
}

Assistant:

inline CodedInputStream::CodedInputStream(const uint8* buffer, int size)
  : input_(NULL),
    buffer_(buffer),
    buffer_end_(buffer + size),
    total_bytes_read_(size),
    overflow_bytes_(0),
    last_tag_(0),
    legitimate_message_end_(false),
    aliasing_enabled_(false),
    current_limit_(size),
    buffer_size_after_limit_(0),
    total_bytes_limit_(kDefaultTotalBytesLimit),
    total_bytes_warning_threshold_(kDefaultTotalBytesWarningThreshold),
    recursion_depth_(0),
    recursion_limit_(default_recursion_limit_),
    extension_pool_(NULL),
    extension_factory_(NULL) {
  // Note that setting current_limit_ == size is important to prevent some
  // code paths from trying to access input_ and segfaulting.
}